

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall CheaterBotStrategy::cheaterReinforce(CheaterBotStrategy *this)

{
  pointer ppCVar1;
  Country *pCVar2;
  pointer pcVar3;
  ostream *poVar4;
  PlayerState *pPVar5;
  Player *pPVar6;
  int iVar7;
  pointer ppCVar8;
  long *local_58;
  long local_50;
  long local_48 [2];
  CheaterBotStrategy *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "We have a cheater! They are doubling all armies on their countries",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pPVar6 = (this->super_PlayerStrategy).player;
  ppCVar8 = (pPVar6->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (pPVar6->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar8 != ppCVar1) {
    local_38 = this;
    do {
      pCVar2 = *ppCVar8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[CHEATER] - Country ",0x14);
      pcVar3 = (pCVar2->cyName->_M_dataplus)._M_p;
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + pCVar2->cyName->_M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," had ",5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pCVar2->pNumberOfTroops);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," armies. It now has ",0x14);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      iVar7 = *pCVar2->pNumberOfTroops;
      if (0 < iVar7) {
        iVar7 = iVar7 * 2;
        *pCVar2->pNumberOfTroops = iVar7;
      }
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," armies. -",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      ppCVar8 = ppCVar8 + 1;
    } while (ppCVar8 != ppCVar1);
    pPVar6 = (local_38->super_PlayerStrategy).player;
    this = local_38;
  }
  operator_delete(pPVar6->currentState,4);
  pPVar5 = (PlayerState *)operator_new(4);
  *pPVar5 = IDLE;
  pPVar6->currentState = pPVar5;
  (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int CheaterBotStrategy::cheaterReinforce() {
    std::cout << "We have a cheater! They are doubling all armies on their countries" << std::endl;

    for(auto* country : *this->player->getOwnedCountries()) {
        std::cout << "[CHEATER] - Country " << country->getCountryName() << " had " << country->getNumberOfTroops() << " armies. It now has ";
        //prevent overflow
        if(country->getNumberOfTroops() * 2 > 0 && country->getNumberOfTroops() * 2 < 2147483647){
            country->setNumberOfTroops(country->getNumberOfTroops() * 2);
        }
        std::cout << country->getNumberOfTroops() << " armies. -" << std::endl;
    }

    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}